

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NeuralNetwork.pb.h
# Opt level: O1

MultiplyBroadcastableLayerParams * __thiscall
CoreML::Specification::NeuralNetworkLayer::_internal_mutable_multiplybroadcastable
          (NeuralNetworkLayer *this)

{
  ulong uVar1;
  MultiplyBroadcastableLayerParams *pMVar2;
  Arena *arena;
  
  if (this->_oneof_case_[0] != 900) {
    clear_layer(this);
    this->_oneof_case_[0] = 900;
    uVar1 = (this->super_MessageLite)._internal_metadata_.ptr_;
    arena = (Arena *)(uVar1 & 0xfffffffffffffffc);
    if ((uVar1 & 1) != 0) {
      arena = *(Arena **)arena;
    }
    pMVar2 = google::protobuf::Arena::
             CreateMaybeMessage<CoreML::Specification::MultiplyBroadcastableLayerParams>(arena);
    (this->layer_).multiplybroadcastable_ = pMVar2;
  }
  return (MultiplyBroadcastableLayerParams *)(this->layer_).convolution_;
}

Assistant:

inline ::CoreML::Specification::MultiplyBroadcastableLayerParams* NeuralNetworkLayer::_internal_mutable_multiplybroadcastable() {
  if (!_internal_has_multiplybroadcastable()) {
    clear_layer();
    set_has_multiplybroadcastable();
    layer_.multiplybroadcastable_ = CreateMaybeMessage< ::CoreML::Specification::MultiplyBroadcastableLayerParams >(GetArenaForAllocation());
  }
  return layer_.multiplybroadcastable_;
}